

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiNavLayer in_EDI;
  ImGuiContext *g;
  undefined4 in_stack_00000010;
  ImRect *in_stack_ffffffffffffffe8;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->NavLayer = in_EDI;
  if (in_EDI == ImGuiNavLayer_Main) {
    pIVar1 = ImGui::NavRestoreLastChildNavWindow(pIVar2->NavWindow);
    pIVar2->NavWindow = pIVar1;
    if (pIVar2->NavWindow->NavLastIds[0] != 0) {
      ImGui::SetNavIDWithRectRel
                ((ImGuiID)((ulong)pIVar2 >> 0x20),(int)pIVar2,in_stack_ffffffffffffffe8);
      return;
    }
  }
  ImGui::NavInitWindow((ImGuiWindow *)CONCAT44(layer,in_stack_00000010),g._7_1_);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    if (layer == 0 && g.NavWindow->NavLastIds[0] != 0)
        ImGui::SetNavIDWithRectRel(g.NavWindow->NavLastIds[0], layer, g.NavWindow->NavRectRel[0]);
    else
        ImGui::NavInitWindow(g.NavWindow, true);
}